

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::updateBounds(btSoftBody *this)

{
  long *plVar1;
  btCollisionShape *pbVar2;
  btBroadphaseProxy *pbVar3;
  btCollisionObject *in_RDI;
  btVector3 bVar4;
  btVector3 mrg;
  btScalar csm;
  btVector3 *maxs;
  btVector3 *mins;
  btVector3 *this_00;
  btVector3 *in_stack_ffffffffffffff70;
  btVector3 *v1;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74;
  btVector3 local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  btVector3 local_3c;
  btVector3 local_2c;
  btScalar local_1c;
  btVector3 *local_18;
  btVector3 *local_10;
  
  if (in_RDI[3].m_collisionShape == (btCollisionShape *)0x0) {
    local_74 = 0.0;
    local_78 = 0.0;
    local_7c = 0.0;
    btVector3::btVector3(&local_70,&local_74,&local_78,&local_7c);
    *(undefined8 *)(in_RDI[3].m_anisotropicFriction.m_floats + 3) = local_70.m_floats._0_8_;
    *(undefined8 *)&in_RDI[3].m_contactProcessingThreshold = local_70.m_floats._8_8_;
    *(undefined8 *)(in_RDI[3].m_interpolationAngularVelocity.m_floats + 3) =
         *(undefined8 *)(in_RDI[3].m_anisotropicFriction.m_floats + 3);
    *(undefined8 *)(in_RDI[3].m_anisotropicFriction.m_floats + 1) =
         *(undefined8 *)&in_RDI[3].m_contactProcessingThreshold;
  }
  else {
    local_10 = btDbvtAabbMm::Mins((btDbvtAabbMm *)in_RDI[3].m_collisionShape);
    local_18 = btDbvtAabbMm::Maxs((btDbvtAabbMm *)in_RDI[3].m_collisionShape);
    pbVar2 = btCollisionObject::getCollisionShape(in_RDI);
    (*pbVar2->_vptr_btCollisionShape[0xc])();
    this_00 = &local_3c;
    btVector3::btVector3(this_00,&local_1c,&local_1c,&local_1c);
    local_40 = 0x3f800000;
    bVar4 = ::operator*(in_stack_ffffffffffffff70,this_00->m_floats);
    local_2c.m_floats._8_8_ = bVar4.m_floats._8_8_;
    local_2c.m_floats._0_8_ = bVar4.m_floats._0_8_;
    v1 = &local_2c;
    bVar4 = operator-(v1,this_00);
    uStack_48 = bVar4.m_floats._8_8_;
    local_50 = bVar4.m_floats._0_8_;
    *(undefined8 *)(in_RDI[3].m_interpolationAngularVelocity.m_floats + 3) = local_50;
    *(undefined8 *)(in_RDI[3].m_anisotropicFriction.m_floats + 1) = uStack_48;
    bVar4 = operator+(v1,this_00);
    local_58 = bVar4.m_floats._8_8_;
    local_60 = bVar4.m_floats._0_8_;
    *(undefined8 *)(in_RDI[3].m_anisotropicFriction.m_floats + 3) = local_60;
    *(undefined8 *)&in_RDI[3].m_contactProcessingThreshold = local_58;
    pbVar3 = btCollisionObject::getBroadphaseHandle(in_RDI);
    if (pbVar3 != (btBroadphaseProxy *)0x0) {
      plVar1 = *(long **)(*(long *)in_RDI[2].m_anisotropicFriction.m_floats + 0x20);
      pbVar3 = btCollisionObject::getBroadphaseHandle(in_RDI);
      (**(code **)(*plVar1 + 0x20))
                (plVar1,pbVar3,in_RDI[3].m_interpolationAngularVelocity.m_floats + 3,
                 in_RDI[3].m_anisotropicFriction.m_floats + 3,
                 *(undefined8 *)(*(long *)in_RDI[2].m_anisotropicFriction.m_floats + 0x28));
    }
  }
  return;
}

Assistant:

void					btSoftBody::updateBounds()
{
	/*if( m_acceleratedSoftBody )
	{
		// If we have an accelerated softbody we need to obtain the bounds correctly
		// For now (slightly hackily) just have a very large AABB
		// TODO: Write get bounds kernel
		// If that is updating in place, atomic collisions might be low (when the cloth isn't perfectly aligned to an axis) and we could
		// probably do a test and exchange reasonably efficiently.

		m_bounds[0] = btVector3(-1000, -1000, -1000);
		m_bounds[1] = btVector3(1000, 1000, 1000);

	} else {*/
		if(m_ndbvt.m_root)
		{
			const btVector3&	mins=m_ndbvt.m_root->volume.Mins();
			const btVector3&	maxs=m_ndbvt.m_root->volume.Maxs();
			const btScalar		csm=getCollisionShape()->getMargin();
			const btVector3		mrg=btVector3(	csm,
				csm,
				csm)*1; // ??? to investigate...
			m_bounds[0]=mins-mrg;
			m_bounds[1]=maxs+mrg;
			if(0!=getBroadphaseHandle())
			{					
				m_worldInfo->m_broadphase->setAabb(	getBroadphaseHandle(),
					m_bounds[0],
					m_bounds[1],
					m_worldInfo->m_dispatcher);
			}
		}
		else
		{
			m_bounds[0]=
				m_bounds[1]=btVector3(0,0,0);
		}		
	//}
}